

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElementTable.h
# Opt level: O0

void __thiscall
psy::TextElementTable<psy::C::IntegerConstant>::reset
          (TextElementTable<psy::C::IntegerConstant> *this)

{
  int iVar1;
  IntegerConstant **ppIVar2;
  IntegerConstant *this_00;
  IntegerConstant **local_20;
  IntegerConstant **it;
  IntegerConstant **last;
  TextElementTable<psy::C::IntegerConstant> *this_local;
  
  if (this->elements_ != (IntegerConstant **)0x0) {
    ppIVar2 = this->elements_;
    iVar1 = this->count_;
    for (local_20 = this->elements_; local_20 != ppIVar2 + (long)iVar1 + 1; local_20 = local_20 + 1)
    {
      this_00 = *local_20;
      if (this_00 != (IntegerConstant *)0x0) {
        C::IntegerConstant::~IntegerConstant(this_00);
        operator_delete(this_00,0x30);
      }
    }
    free(this->elements_);
  }
  if (this->buckets_ != (IntegerConstant **)0x0) {
    free(this->buckets_);
  }
  this->elements_ = (IntegerConstant **)0x0;
  this->buckets_ = (IntegerConstant **)0x0;
  this->allocated_ = 0;
  this->count_ = -1;
  this->bucketCount_ = 0;
  return;
}

Assistant:

void reset()
    {
        if (elements_) {
            ElemT** last = elements_ + count_ + 1;
            for (ElemT** it = elements_; it != last; ++it)
                delete *it;
            std::free(elements_);
        }

        if (buckets_)
            std::free(buckets_);

        elements_ = 0;
        buckets_ = 0;
        allocated_ = 0;
        count_ = -1;
        bucketCount_ = 0;
    }